

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::PrintUTF8ErrorLog
          (internal *this,string_view message_name,string_view field_name,char *operation_str,
          bool emit_stacktrace)

{
  long *plVar1;
  char *pcVar2;
  AlphaNum *__s;
  AlphaNum *c;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_00;
  string quoted_field_name;
  string error_message;
  string stacktrace;
  long *local_150;
  undefined8 local_148;
  long local_140 [2];
  undefined1 local_130 [48];
  undefined1 *local_100;
  size_type local_f8;
  undefined1 local_f0;
  undefined7 uStack_ef;
  string local_e0;
  LogMessage local_c0;
  internal *local_b0;
  long *local_a8;
  undefined8 local_a0;
  char *local_98;
  char *local_90;
  AlphaNum *local_88;
  undefined8 local_80;
  char *local_78;
  size_type local_70;
  undefined1 *local_68;
  AlphaNum local_60;
  
  __s = (AlphaNum *)field_name._M_str;
  pcVar2 = message_name._M_str;
  local_f8 = 0;
  local_f0 = 0;
  local_150 = local_140;
  c = __s;
  local_100 = &local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
  if (pcVar2 != (char *)0x0) {
    if (this == (internal *)0x0) {
      local_c0.errno_saver_.saved_errno_ = 2;
      local_c0._4_4_ = 0;
      local_c0.data_._M_t.
      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )((long)
                        "It defaulted to local from file-level \'option features.default_symbol_visibility = \'"
                       + 0x52);
      local_60.piece_._M_len = 1;
      local_60.piece_._M_str = "\'";
      local_130._0_8_ = pcVar2;
      local_130._8_8_ = (char *)field_name._M_len;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_e0,(lts_20250127 *)&local_c0,(AlphaNum *)local_130,&local_60,c);
      std::__cxx11::string::operator=((string *)&local_150,(string *)&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p == &local_e0.field_2) goto LAB_00315dd0;
    }
    else {
      local_c0.errno_saver_.saved_errno_ = 2;
      local_c0._4_4_ = 0;
      local_c0.data_._M_t.
      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )((long)
                        "It defaulted to local from file-level \'option features.default_symbol_visibility = \'"
                       + 0x52);
      local_a0 = 1;
      local_98 = ".";
      local_80 = 1;
      local_78 = "\'";
      pieces._M_len = (size_type)".";
      pieces._M_array = (iterator)0x5;
      local_b0 = this;
      local_a8 = (long *)message_name._M_len;
      local_90 = pcVar2;
      local_88 = (AlphaNum *)field_name._M_len;
      absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                ((string *)local_130,(strings_internal *)&local_c0,pieces);
      std::__cxx11::string::operator=((string *)&local_150,(string *)local_130);
      local_e0.field_2._M_allocated_capacity = local_130._16_8_;
      local_e0._M_dataplus._M_p = (pointer)local_130._0_8_;
      if ((undefined1 *)local_130._0_8_ == local_130 + 0x10) goto LAB_00315dd0;
    }
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
LAB_00315dd0:
  plVar1 = local_150;
  if (__s == (AlphaNum *)0x0) {
    local_90 = (char *)0x0;
  }
  else {
    local_90 = (char *)strlen((char *)__s);
  }
  local_c0.errno_saver_.saved_errno_ = 0xc;
  local_c0._4_4_ = 0;
  local_c0.data_._M_t.
  super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  ._M_t.
  super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
  .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
  _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                  )(__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                    )0x48bd8b;
  local_b0 = (internal *)local_148;
  local_a8 = plVar1;
  local_a0 = 0x22;
  local_98 = " contains invalid UTF-8 data when ";
  local_80 = 0x4a;
  local_78 = " a protocol buffer. Use the \'bytes\' type if you intend to send raw bytes. ";
  local_70 = local_f8;
  local_68 = local_100;
  pieces_00._M_len = local_f8;
  pieces_00._M_array = (iterator)&DAT_00000006;
  local_88 = __s;
  absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
            ((string *)local_130,(strings_internal *)&local_c0,pieces_00);
  absl::lts_20250127::log_internal::LogMessage::LogMessage
            (&local_c0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_lite.cc"
             ,0x242);
  absl::lts_20250127::log_internal::LogMessage::operator<<(&local_c0,(string *)local_130);
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_c0);
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  if (local_150 != local_140) {
    operator_delete(local_150,local_140[0] + 1);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100,CONCAT71(uStack_ef,local_f0) + 1);
  }
  return;
}

Assistant:

void PrintUTF8ErrorLog(absl::string_view message_name,
                       absl::string_view field_name, const char* operation_str,
                       bool emit_stacktrace) {
  std::string stacktrace;
  (void)emit_stacktrace;  // Parameter is used by Google-internal code.
  std::string quoted_field_name = "";
  if (!field_name.empty()) {
    if (!message_name.empty()) {
      quoted_field_name =
          absl::StrCat(" '", message_name, ".", field_name, "'");
    } else {
      quoted_field_name = absl::StrCat(" '", field_name, "'");
    }
  }
  std::string error_message =
      absl::StrCat("String field", quoted_field_name,
                   " contains invalid UTF-8 data "
                   "when ",
                   operation_str,
                   " a protocol buffer. Use the 'bytes' type if you intend to "
                   "send raw bytes. ",
                   stacktrace);
  ABSL_LOG(ERROR) << error_message;
}